

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_stop_seq(Parser *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  NodeData *pNVar5;
  csubstr cVar6;
  char *pcStack_58;
  size_t local_50;
  char msg [49];
  
  pNVar5 = Tree::_p(this->m_tree,this->m_state->node_id);
  if (((pNVar5->m_type).type & SEQ) == NOTYPE) {
    builtin_strncpy(msg + 0x20,"state->node_id))",0x11);
    builtin_strncpy(msg + 0x10,"_tree->is_seq(m_",0x10);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar6.len;
    pcStack_58 = cVar6.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x78c4) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x78c4) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x31,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  return;
}

Assistant:

void Parser::_stop_seq()
{
    _c4dbgp("stop_seq");
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(m_state->node_id));
}